

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_abc_k(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  IRIns *pIVar3;
  int32_t k;
  IRIns *ir;
  IRRef asize;
  IRRef ref;
  jit_State *J_local;
  
  if ((J->flags & 0x800000) == 0) {
    J_local._4_4_ = 0;
  }
  else {
    uVar2 = (uint)(J->fold).ins.field_0.op1;
    uVar1 = J->chain[10];
    while (ir._4_4_ = (uint)uVar1, uVar2 < ir._4_4_) {
      pIVar3 = (J->cur).ir + ir._4_4_;
      if (((pIVar3->field_0).op1 == uVar2) && ((pIVar3->field_0).op2 < 0x8000)) {
        if ((J->cur).ir[(pIVar3->field_0).op2].i < (J->fold).right[0].i) {
          (pIVar3->field_0).op2 = (J->fold).ins.field_0.op2;
        }
        return 4;
      }
      uVar1 = (pIVar3->field_0).prev;
    }
    J_local._4_4_ = lj_ir_emit(J);
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(ABC any KINT)
LJFOLDF(abc_k)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    IRRef ref = J->chain[IR_ABC];
    IRRef asize = fins->op1;
    while (ref > asize) {
      IRIns *ir = IR(ref);
      if (ir->op1 == asize && irref_isk(ir->op2)) {
	int32_t k = IR(ir->op2)->i;
	if (fright->i > k)
	  ir->op2 = fins->op2;
	return DROPFOLD;
      }
      ref = ir->prev;
    }
    return EMITFOLD;  /* Already performed CSE. */
  }
  return NEXTFOLD;
}